

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMatch.c
# Opt level: O2

float Amap_ManComputeMapping(Amap_Man_t *p)

{
  int fCompl;
  Amap_Obj_t *pObj;
  Amap_Obj_t *pObj_00;
  int i;
  float fVar1;
  float fVar2;
  
  Amap_ManCleanRefs(p);
  fVar1 = 0.0;
  for (i = 0; i < p->vPos->nSize; i = i + 1) {
    pObj = (Amap_Obj_t *)Vec_PtrEntry(p->vPos,i);
    pObj_00 = Amap_ObjFanin0(p,pObj);
    fCompl = Abc_LitIsCompl(pObj->Fan[0]);
    fVar2 = Amap_ManComputeMapping_rec(p,pObj_00,fCompl);
    fVar1 = fVar1 + fVar2;
  }
  return fVar1;
}

Assistant:

float Amap_ManComputeMapping( Amap_Man_t * p )
{
    Amap_Obj_t * pObj;
    float Area = 0.0;
    int i;
    Amap_ManCleanRefs( p );
    Amap_ManForEachPo( p, pObj, i )
        Area += Amap_ManComputeMapping_rec( p, Amap_ObjFanin0(p, pObj), Amap_ObjFaninC0(pObj) );
    return Area;
}